

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_cluster_ping(intptr_t uuid,fio_protocol_s *pr_)

{
  fio_str_info_s ch;
  fio_str_info_s data;
  fio_msg_internal_s *m;
  
  ch.data = (char *)0x0;
  ch.capa = 0;
  ch.len = 0;
  data.data = (char *)0x0;
  data.capa = 0;
  data.len = 0;
  m = fio_msg_internal_create(0,10,ch,data,'\0','\x01');
  fio_msg_internal_send_dup(uuid,m);
  fio_msg_internal_free(m);
  return;
}

Assistant:

static void fio_cluster_ping(intptr_t uuid, fio_protocol_s *pr_) {
  fio_msg_internal_s *m = fio_msg_internal_create(
      0, FIO_CLUSTER_MSG_PING, (fio_str_info_s){.len = 0},
      (fio_str_info_s){.len = 0}, 0, 1);
  fio_msg_internal_send_dup(uuid, m);
  fio_msg_internal_free(m);
  (void)pr_;
}